

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

void __thiscall
capnp::MallocMessageBuilder::MallocMessageBuilder
          (MallocMessageBuilder *this,uint firstSegmentWords,AllocationStrategy allocationStrategy)

{
  AllocationStrategy allocationStrategy_local;
  uint firstSegmentWords_local;
  MallocMessageBuilder *this_local;
  
  MessageBuilder::MessageBuilder(&this->super_MessageBuilder);
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__MallocMessageBuilder_0039e0c0;
  *(uint *)&(this->super_MessageBuilder).field_0xbc = firstSegmentWords;
  this->allocationStrategy = allocationStrategy;
  this->ownFirstSegment = true;
  this->returnedFirstSegment = false;
  this->firstSegment = (void *)0x0;
  kj::Vector<void_*>::Vector(&this->moreSegments);
  return;
}

Assistant:

MallocMessageBuilder::MallocMessageBuilder(
    uint firstSegmentWords, AllocationStrategy allocationStrategy)
    : nextSize(firstSegmentWords), allocationStrategy(allocationStrategy),
      ownFirstSegment(true), returnedFirstSegment(false), firstSegment(nullptr) {}